

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPChar cp_get_bs(CPState *cp)

{
  char cVar1;
  char cVar2;
  byte *pbVar3;
  bool local_49;
  CPChar c;
  CPChar c2;
  CPState *cp_local;
  CPChar local_24;
  
  cVar1 = *cp->p;
  local_49 = cVar1 == '\n' || cVar1 == '\r';
  if (local_49) {
    cp->p = cp->p + 1;
    cVar2 = *cp->p;
    if ((cVar2 == '\n' || cVar2 == '\r') && (cVar2 != cVar1)) {
      cp->p = cp->p + 1;
    }
    cp->linenumber = cp->linenumber + 1;
    pbVar3 = (byte *)cp->p;
    cp->p = (char *)(pbVar3 + 1);
    cp->c = (uint)*pbVar3;
    if (cp->c == 0x5c) {
      local_24 = cp_get_bs(cp);
    }
    else {
      local_24 = cp->c;
    }
    cp_local._4_4_ = local_24;
  }
  else {
    cp_local._4_4_ = cp->c;
  }
  return cp_local._4_4_;
}

Assistant:

static LJ_NOINLINE CPChar cp_get_bs(CPState *cp)
{
  CPChar c2, c = cp_rawpeek(cp);
  if (!cp_iseol(c)) return cp->c;
  cp->p++;
  c2 = cp_rawpeek(cp);
  if (cp_iseol(c2) && c2 != c) cp->p++;
  cp->linenumber++;
  return cp_get(cp);
}